

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_persistence_matrix_column_chain.cpp
# Opt level: O1

void __thiscall
Chain_z5_column_operators<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_>
::test_method(Chain_z5_column_operators<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_>
              *this)

{
  vector<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_>_>
  matrix;
  Column_settings settings;
  vector<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_>_>
  vStack_48;
  Zp_field_operators<unsigned_int,_void> local_30;
  
  Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::Zp_field_operators(&local_30,5)
  ;
  build_column_matrix<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)0,false,false,false>>>>
            (&vStack_48,(Column_settings *)&local_30);
  column_test_common_z5_operators<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)0,false,false,false>>>>
            (&vStack_48);
  std::
  vector<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_>_>
  ::~vector(&vStack_48);
  if (local_30.inverse_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.inverse_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_30.inverse_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.inverse_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE_TEMPLATE(Chain_z5_column_operators, Column, z5_no_row_access_columns) {
  typename Column::Column_settings settings(5);
  std::vector<Column> matrix = build_column_matrix<Column>(settings);
  column_test_common_z5_operators(matrix);
}